

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<long,duckdb::interval_t,duckdb::interval_t,duckdb::BinaryStandardOperatorWrapper,duckdb::MultiplyOperator,bool,false,true>
               (long *ldata,interval_t *rdata,interval_t *result_data,idx_t count,ValidityMask *mask
               ,bool fun)

{
  unsigned_long *puVar1;
  MultiplyOperator *pMVar2;
  int64_t iVar3;
  ulong uVar4;
  ulong uVar5;
  int64_t *piVar6;
  ulong uVar7;
  idx_t iVar8;
  unsigned_long uVar9;
  ulong uVar10;
  ulong uVar11;
  interval_t iVar12;
  interval_t left;
  interval_t left_00;
  int64_t *local_68;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      pMVar2 = *(MultiplyOperator **)rdata;
      iVar3 = rdata->micros;
      iVar8 = 0;
      piVar6 = (int64_t *)count;
      local_68 = &result_data->micros;
      do {
        iVar12.micros = ldata[iVar8];
        iVar12._0_8_ = iVar3;
        iVar12 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                           (pMVar2,iVar12,(int64_t)piVar6);
        ((interval_t *)(local_68 + -1))->months = (int)iVar12._0_8_;
        ((interval_t *)(local_68 + -1))->days = (int)((ulong)iVar12._0_8_ >> 0x20);
        *local_68 = iVar12.micros;
        iVar8 = iVar8 + 1;
        piVar6 = local_68 + 2;
        local_68 = piVar6;
      } while (count != iVar8);
    }
  }
  else if (0x3f < count + 0x3f) {
    uVar5 = 0;
    uVar4 = 0;
    do {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar9 = 0xffffffffffffffff;
      }
      else {
        uVar9 = puVar1[uVar5];
      }
      uVar10 = uVar4 + 0x40;
      if (count <= uVar4 + 0x40) {
        uVar10 = count;
      }
      uVar7 = uVar10;
      if (uVar9 != 0) {
        uVar7 = uVar4;
        if (uVar9 == 0xffffffffffffffff) {
          if (uVar4 < uVar10) {
            pMVar2 = *(MultiplyOperator **)rdata;
            iVar3 = rdata->micros;
            piVar6 = &result_data[uVar4].micros;
            uVar4 = uVar5;
            do {
              left.micros = ldata[uVar7];
              left._0_8_ = iVar3;
              iVar12 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                                 (pMVar2,left,uVar4);
              ((interval_t *)(piVar6 + -1))->months = (int)iVar12._0_8_;
              ((interval_t *)(piVar6 + -1))->days = (int)((ulong)iVar12._0_8_ >> 0x20);
              *piVar6 = iVar12.micros;
              uVar7 = uVar7 + 1;
              piVar6 = piVar6 + 2;
            } while (uVar10 != uVar7);
          }
        }
        else if (uVar4 < uVar10) {
          piVar6 = &result_data[uVar4].micros;
          uVar11 = 0;
          uVar7 = uVar5;
          do {
            if ((uVar9 >> (uVar11 & 0x3f) & 1) != 0) {
              left_00.micros = ldata[uVar4 + uVar11];
              left_00._0_8_ = rdata->micros;
              iVar12 = MultiplyOperator::Operation<duckdb::interval_t,long,duckdb::interval_t>
                                 (*(MultiplyOperator **)rdata,left_00,uVar7);
              ((interval_t *)(piVar6 + -1))->months = (int)iVar12._0_8_;
              ((interval_t *)(piVar6 + -1))->days = (int)((ulong)iVar12._0_8_ >> 0x20);
              *piVar6 = iVar12.micros;
            }
            uVar11 = uVar11 + 1;
            piVar6 = piVar6 + 2;
          } while ((uVar4 - uVar10) + uVar11 != 0);
          uVar7 = uVar4 + uVar11;
        }
      }
      uVar5 = uVar5 + 1;
      uVar4 = uVar7;
    } while (uVar5 != count + 0x3f >> 6);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}